

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O1

void __thiscall spvtools::opt::RelaxFloatOpsPass::Initialize(RelaxFloatOpsPass *this)

{
  long lVar1;
  undefined4 *puVar2;
  Op *pOVar3;
  byte bVar4;
  initializer_list<spv::Op> __l;
  initializer_list<spv::Op> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<spv::Op> __l_02;
  Op local_d8 [50];
  
  bVar4 = 0;
  puVar2 = &DAT_0077bbf8;
  pOVar3 = local_d8;
  for (lVar1 = 0x1b; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pOVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    pOVar3 = pOVar3 + 1;
  }
  __l._M_len = 0x1b;
  __l._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->target_ops_core_f_rslt_)._M_h,__l);
  local_d8[8] = OpFOrdLessThanEqual;
  local_d8[9] = OpFUnordLessThanEqual;
  local_d8[10] = OpFOrdGreaterThanEqual;
  local_d8[0xb] = OpFUnordGreaterThanEqual;
  local_d8[4] = OpFOrdLessThan;
  local_d8[5] = OpFUnordLessThan;
  local_d8[6] = OpFOrdGreaterThan;
  local_d8[7] = OpFUnordGreaterThan;
  local_d8[0] = OpFOrdEqual;
  local_d8[1] = OpFUnordEqual;
  local_d8[2] = OpFOrdNotEqual;
  local_d8[3] = OpFUnordNotEqual;
  __l_00._M_len = 0xc;
  __l_00._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->target_ops_core_f_opnd_)._M_h,__l_00);
  memcpy(local_d8,&DAT_0077bc94,200);
  __l_01._M_len = 0x32;
  __l_01._M_array = local_d8;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->target_ops_450_)._M_h,__l_01);
  puVar2 = &DAT_0077bd5c;
  pOVar3 = local_d8;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pOVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pOVar3 = pOVar3 + (ulong)bVar4 * -2 + 1;
  }
  __l_02._M_len = 0x19;
  __l_02._M_array = local_d8;
  std::
  _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=(&(this->sample_ops_)._M_h,__l_02);
  return;
}

Assistant:

void RelaxFloatOpsPass::Initialize() {
  target_ops_core_f_rslt_ = {
      spv::Op::OpLoad,
      spv::Op::OpPhi,
      spv::Op::OpVectorExtractDynamic,
      spv::Op::OpVectorInsertDynamic,
      spv::Op::OpVectorShuffle,
      spv::Op::OpCompositeExtract,
      spv::Op::OpCompositeConstruct,
      spv::Op::OpCompositeInsert,
      spv::Op::OpCopyObject,
      spv::Op::OpTranspose,
      spv::Op::OpConvertSToF,
      spv::Op::OpConvertUToF,
      spv::Op::OpFConvert,
      // spv::Op::OpQuantizeToF16,
      spv::Op::OpFNegate,
      spv::Op::OpFAdd,
      spv::Op::OpFSub,
      spv::Op::OpFMul,
      spv::Op::OpFDiv,
      spv::Op::OpFMod,
      spv::Op::OpVectorTimesScalar,
      spv::Op::OpMatrixTimesScalar,
      spv::Op::OpVectorTimesMatrix,
      spv::Op::OpMatrixTimesVector,
      spv::Op::OpMatrixTimesMatrix,
      spv::Op::OpOuterProduct,
      spv::Op::OpDot,
      spv::Op::OpSelect,
  };
  target_ops_core_f_opnd_ = {
      spv::Op::OpFOrdEqual,
      spv::Op::OpFUnordEqual,
      spv::Op::OpFOrdNotEqual,
      spv::Op::OpFUnordNotEqual,
      spv::Op::OpFOrdLessThan,
      spv::Op::OpFUnordLessThan,
      spv::Op::OpFOrdGreaterThan,
      spv::Op::OpFUnordGreaterThan,
      spv::Op::OpFOrdLessThanEqual,
      spv::Op::OpFUnordLessThanEqual,
      spv::Op::OpFOrdGreaterThanEqual,
      spv::Op::OpFUnordGreaterThanEqual,
  };
  target_ops_450_ = {
      GLSLstd450Round, GLSLstd450RoundEven, GLSLstd450Trunc, GLSLstd450FAbs,
      GLSLstd450FSign, GLSLstd450Floor, GLSLstd450Ceil, GLSLstd450Fract,
      GLSLstd450Radians, GLSLstd450Degrees, GLSLstd450Sin, GLSLstd450Cos,
      GLSLstd450Tan, GLSLstd450Asin, GLSLstd450Acos, GLSLstd450Atan,
      GLSLstd450Sinh, GLSLstd450Cosh, GLSLstd450Tanh, GLSLstd450Asinh,
      GLSLstd450Acosh, GLSLstd450Atanh, GLSLstd450Atan2, GLSLstd450Pow,
      GLSLstd450Exp, GLSLstd450Log, GLSLstd450Exp2, GLSLstd450Log2,
      GLSLstd450Sqrt, GLSLstd450InverseSqrt, GLSLstd450Determinant,
      GLSLstd450MatrixInverse,
      // TODO(greg-lunarg): GLSLstd450ModfStruct,
      GLSLstd450FMin, GLSLstd450FMax, GLSLstd450FClamp, GLSLstd450FMix,
      GLSLstd450Step, GLSLstd450SmoothStep, GLSLstd450Fma,
      // TODO(greg-lunarg): GLSLstd450FrexpStruct,
      GLSLstd450Ldexp, GLSLstd450Length, GLSLstd450Distance, GLSLstd450Cross,
      GLSLstd450Normalize, GLSLstd450FaceForward, GLSLstd450Reflect,
      GLSLstd450Refract, GLSLstd450NMin, GLSLstd450NMax, GLSLstd450NClamp};
  sample_ops_ = {spv::Op::OpImageSampleImplicitLod,
                 spv::Op::OpImageSampleExplicitLod,
                 spv::Op::OpImageSampleDrefImplicitLod,
                 spv::Op::OpImageSampleDrefExplicitLod,
                 spv::Op::OpImageSampleProjImplicitLod,
                 spv::Op::OpImageSampleProjExplicitLod,
                 spv::Op::OpImageSampleProjDrefImplicitLod,
                 spv::Op::OpImageSampleProjDrefExplicitLod,
                 spv::Op::OpImageFetch,
                 spv::Op::OpImageGather,
                 spv::Op::OpImageDrefGather,
                 spv::Op::OpImageRead,
                 spv::Op::OpImageSparseSampleImplicitLod,
                 spv::Op::OpImageSparseSampleExplicitLod,
                 spv::Op::OpImageSparseSampleDrefImplicitLod,
                 spv::Op::OpImageSparseSampleDrefExplicitLod,
                 spv::Op::OpImageSparseSampleProjImplicitLod,
                 spv::Op::OpImageSparseSampleProjExplicitLod,
                 spv::Op::OpImageSparseSampleProjDrefImplicitLod,
                 spv::Op::OpImageSparseSampleProjDrefExplicitLod,
                 spv::Op::OpImageSparseFetch,
                 spv::Op::OpImageSparseGather,
                 spv::Op::OpImageSparseDrefGather,
                 spv::Op::OpImageSparseTexelsResident,
                 spv::Op::OpImageSparseRead};
}